

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildInit(ImFontAtlas *atlas)

{
  uint uVar1;
  ImVector<ImFontConfig> *this;
  ImFontConfig *pIVar2;
  uint *in_RDI;
  float fVar3;
  ImFontConfig *cfg;
  ImFontConfig *__end1;
  ImFontConfig *__begin1;
  ImVector<ImFontConfig> *__range1;
  ImFontConfig *local_18;
  int width;
  
  this = (ImVector<ImFontConfig> *)(in_RDI + 0x1e);
  local_18 = ImVector<ImFontConfig>::begin(this);
  pIVar2 = ImVector<ImFontConfig>::end(this);
  for (; local_18 != pIVar2; local_18 = local_18 + 1) {
    fVar3 = ImTrunc(local_18->SizePixels);
    local_18->SizePixels = fVar3;
  }
  if ((int)in_RDI[0x125] < 0) {
    width = (int)((ulong)in_RDI >> 0x20);
    if ((*in_RDI & 2) == 0) {
      uVar1 = ImFontAtlas::AddCustomRectRegular((ImFontAtlas *)cfg,width,(int)in_RDI);
      in_RDI[0x125] = uVar1;
    }
    else {
      uVar1 = ImFontAtlas::AddCustomRectRegular((ImFontAtlas *)cfg,width,(int)in_RDI);
      in_RDI[0x125] = uVar1;
    }
  }
  if (((int)in_RDI[0x126] < 0) && ((*in_RDI & 4) == 0)) {
    uVar1 = ImFontAtlas::AddCustomRectRegular
                      ((ImFontAtlas *)cfg,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    in_RDI[0x126] = uVar1;
  }
  return;
}

Assistant:

void ImFontAtlasBuildInit(ImFontAtlas* atlas)
{
    // Round font size
    // - We started rounding in 1.90 WIP (18991) as our layout system currently doesn't support non-rounded font size well yet.
    // - Note that using io.FontGlobalScale or SetWindowFontScale(), with are legacy-ish, partially supported features, can still lead to unrounded sizes.
    // - We may support it better later and remove this rounding.
    for (ImFontConfig& cfg : atlas->ConfigData)
       cfg.SizePixels = ImTrunc(cfg.SizePixels);

    // Register texture region for mouse cursors or standard white pixels
    if (atlas->PackIdMouseCursors < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
        else
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(2, 2);
    }

    // Register texture region for thick lines
    // The +2 here is to give space for the end caps, whilst height +1 is to accommodate the fact we have a zero-width row
    if (atlas->PackIdLines < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoBakedLines))
            atlas->PackIdLines = atlas->AddCustomRectRegular(IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 2, IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 1);
    }
}